

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

int32_t ucurr_countCurrencyList(UEnumeration *enumerator,UErrorCode *param_2)

{
  uint uVar1;
  int local_2c;
  int local_28;
  int32_t idx;
  int32_t count;
  uint32_t currType;
  UCurrencyContext *myContext;
  UErrorCode *param_1_local;
  UEnumeration *enumerator_local;
  
  uVar1 = *enumerator->context;
  local_28 = 0;
  local_2c = 0;
  while (gCurrencyList[local_2c].currency != (char *)0x0) {
    if ((uVar1 == 0x7fffffff) || ((gCurrencyList[local_2c].currType & uVar1) == uVar1)) {
      local_28 = local_28 + 1;
    }
    local_2c = local_2c + 1;
  }
  return local_28;
}

Assistant:

static int32_t U_CALLCONV
ucurr_countCurrencyList(UEnumeration *enumerator, UErrorCode * /*pErrorCode*/) {
    UCurrencyContext *myContext = (UCurrencyContext *)(enumerator->context);
    uint32_t currType = myContext->currType;
    int32_t count = 0;

    /* Count the number of items matching the type we are looking for. */
    for (int32_t idx = 0; gCurrencyList[idx].currency != NULL; idx++) {
        if (UCURR_MATCHES_BITMASK(gCurrencyList[idx].currType, currType)) {
            count++;
        }
    }
    return count;
}